

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTPSTRDec(char *val,size_t *len,octet *der,size_t count,u32 tag)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  void *pvVar4;
  size_t count_00;
  size_t sVar5;
  size_t l;
  char *local_40;
  octet *v;
  
  sVar3 = derDec2(&v,&l,der,count,tag);
  count_00 = l;
  sVar5 = 0xffffffffffffffff;
  if (sVar3 != 0xffffffffffffffff) {
    local_40 = val;
    for (sVar5 = 0; pcVar2 = local_40, count_00 != sVar5; sVar5 = sVar5 + 1) {
      bVar1 = v[sVar5];
      if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) &&
         (pvVar4 = memchr(" \'()+,-./:=?",(int)(char)bVar1,0xd), pvVar4 == (void *)0x0)) {
        return 0xffffffffffffffff;
      }
    }
    if (local_40 != (char *)0x0) {
      memMove(local_40,v,count_00);
      pcVar2[l] = '\0';
      count_00 = l;
    }
    sVar5 = sVar3;
    if (len != (size_t *)0x0) {
      *len = count_00;
    }
  }
  return sVar5;
}

Assistant:

size_t derTPSTRDec(char* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t pos;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// проверить символы (см. strIsPrintable())
	for (pos = 0; pos < l; ++pos)
	{
		register char ch = (char)v[pos];
		if ((ch < '0' || ch > '9') &&
			(ch < 'A' || ch > 'Z') &&
			(ch < 'a' || ch > 'z') &&
			strchr(" '()+,-./:=?", ch) == 0)
		{
			ch = 0;
			return SIZE_MAX;
		}
		ch = 0;
	}
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l + 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l + 1));
		memMove(val, v, l);
		val[l] = 0;
	}
	// возвратить длину строки
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}